

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O0

_Bool AES_CCM_Decrypt(COSE_Enveloped *pcose,int TSize,int LSize,byte *pbKey,size_t cbKey,
                     byte *pbCrypto,size_t cbCrypto,byte *pbAuthData,size_t cbAuthData,
                     cose_errback *perr)

{
  int iVar1;
  int iVar2;
  cn_cbor *pcVar3;
  mbedtls_cipher_id_t cipher;
  cn_cbor *pIV;
  byte rgbIV [15];
  int NSize;
  byte *rgbOut;
  undefined1 local_e0 [4];
  int cbOut;
  mbedtls_ccm_context ctx;
  byte *pbCrypto_local;
  size_t cbKey_local;
  byte *pbKey_local;
  int LSize_local;
  int TSize_local;
  COSE_Enveloped *pcose_local;
  
  stack0xffffffffffffff10 = (uchar *)0x0;
  rgbIV._7_4_ = 0xf - LSize / 8;
  ctx._152_8_ = pbCrypto;
  memset((void *)((long)&pIV + 5),0,0xf);
  mbedtls_ccm_init((mbedtls_ccm_context *)local_e0);
  pcVar3 = _COSE_map_get_int(&pcose->m_message,5,7,(cose_errback *)0x0);
  if ((pcVar3 == (cn_cbor *)0x0) || (pcVar3->type != CN_CBOR_BYTES)) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else if (pcVar3->length == rgbIV._7_4_) {
    memcpy((void *)((long)&pIV + 5),(pcVar3->v).bytes,(long)pcVar3->length);
    iVar1 = mbedtls_ccm_setkey((mbedtls_ccm_context *)local_e0,MBEDTLS_CIPHER_ID_AES,pbKey,
                               (uint)(cbKey << 3));
    if (iVar1 == 0) {
      iVar1 = (int)cbCrypto - TSize / 8;
      register0x00000000 = (uchar *)calloc((long)iVar1,1);
      if (register0x00000000 == (uchar *)0x0) {
        if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_OUT_OF_MEMORY;
        }
      }
      else {
        iVar2 = mbedtls_ccm_auth_decrypt
                          ((mbedtls_ccm_context *)local_e0,(long)iVar1,(uchar *)((long)&pIV + 5),
                           (long)(int)rgbIV._7_4_,pbAuthData,cbAuthData,(uchar *)ctx._152_8_,
                           register0x00000000,(uchar *)(ctx._152_8_ + (long)iVar1),(long)(TSize / 8)
                          );
        if (iVar2 == 0) {
          mbedtls_ccm_free((mbedtls_ccm_context *)local_e0);
          pcose->pbContent = stack0xffffffffffffff10;
          pcose->cbContent = (long)iVar1;
          return true;
        }
        if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_CRYPTO_FAIL;
        }
      }
    }
    else if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_CRYPTO_FAIL;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_PARAMETER;
  }
  if (stack0xffffffffffffff10 != (uchar *)0x0) {
    free(stack0xffffffffffffff10);
  }
  mbedtls_ccm_free((mbedtls_ccm_context *)local_e0);
  return false;
}

Assistant:

bool AES_CCM_Decrypt(COSE_Enveloped * pcose, int TSize, int LSize, const byte * pbKey, size_t cbKey, const byte * pbCrypto, size_t cbCrypto, const byte * pbAuthData, size_t cbAuthData, cose_errback * perr)
{

	mbedtls_ccm_context ctx;
	int cbOut;
	byte * rgbOut = NULL;
	int NSize = 15 - (LSize/8);
	byte rgbIV[15] = { 0 };
	const cn_cbor * pIV = NULL;
	mbedtls_cipher_id_t cipher;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = &pcose->m_message.m_allocContext;
#endif

	mbedtls_ccm_init(&ctx);
	
        //  Setup the IV/Nonce and put it into the message
	pIV = _COSE_map_get_int(&pcose->m_message, COSE_Header_IV, COSE_BOTH, NULL);
	if ((pIV == NULL) || (pIV->type!= CN_CBOR_BYTES)) {
		if (perr != NULL) perr->err = COSE_ERR_INVALID_PARAMETER;

	errorReturn:
		if (rgbOut != NULL) COSE_FREE(rgbOut, context);
		mbedtls_ccm_free(&ctx);
		return false;
	}
	CHECK_CONDITION(pIV->length == NSize, COSE_ERR_INVALID_PARAMETER);
	memcpy(rgbIV, pIV->v.str, pIV->length);

	//  Setup and run the mbedTLS code
	cipher = MBEDTLS_CIPHER_ID_AES;
	
        CHECK_CONDITION(!mbedtls_ccm_setkey(&ctx, cipher, pbKey, cbKey*8), COSE_ERR_CRYPTO_FAIL);
	TSize /= 8; // Comes in in bits not bytes.

	cbOut = (int)  cbCrypto - TSize;
	rgbOut = (byte *)COSE_CALLOC(cbOut, 1, context);
	CHECK_CONDITION(rgbOut != NULL, COSE_ERR_OUT_OF_MEMORY);
        
		
	CHECK_CONDITION(!mbedtls_ccm_auth_decrypt(&ctx, cbOut, rgbIV, NSize, pbAuthData, cbAuthData, pbCrypto, rgbOut, &pbCrypto[cbOut], TSize), COSE_ERR_CRYPTO_FAIL);
        
	mbedtls_ccm_free(&ctx);
	pcose->pbContent = rgbOut;
	pcose->cbContent = cbOut;

	return true;
}